

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

string * __thiscall
OpenMD::Stats::getDataType_abi_cxx11_(string *__return_storage_ptr__,Stats *this,int index)

{
  pointer pSVar1;
  pointer pcVar2;
  
  pSVar1 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = pSVar1[index].dataType._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + pSVar1[index].dataType._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Stats::getDataType(int index) {
    assert(index >= 0 && index < ENDINDEX);
    return data_[index].dataType;
  }